

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)p->nSimWords;
  if (p->nSimWords < 1) {
    uVar3 = uVar5;
  }
  while( true ) {
    if (uVar3 == uVar5) {
      __assert_fail("i < p->nSimWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x524,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)"
                   );
    }
    if (*(int *)((long)&pObj->pFanout->pFanout + uVar5 * 4) != 0) break;
    uVar5 = uVar5 + 1;
  }
  uVar4 = 0;
  while( true ) {
    if (uVar4 == 0x20) {
      __assert_fail("k < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x529,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)"
                   );
    }
    if ((*(uint *)((long)&pObj->pFanout->pFanout + uVar5 * 4) >> (uVar4 & 0x1f) & 1) != 0) break;
    uVar4 = uVar4 + 1;
  }
  pvVar1 = malloc((long)p->pManFraig->nObjs[1] << 2);
  for (lVar6 = 0; p_00 = p->pManAig->vPis, lVar6 < p_00->nSize; lVar6 = lVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p_00,(int)lVar6);
    *(uint *)((long)pvVar1 + lVar6 * 4) =
         (uint)((*(uint *)(*(long *)((long)pvVar2 + 0x20) + 0x20 + uVar5 * 4) >> (uVar4 & 0x1f) & 1)
               != 0);
  }
  if (p->pManFraig->pData == (void *)0x0) {
    p->pManFraig->pData = pvVar1;
    return;
  }
  __assert_fail("p->pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x535,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigCheckOutputSimsSavePattern( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{ 
    Ivy_FraigSim_t * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            break;
    assert( i < p->nSimWords );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims->pData[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pModel[i] = Ivy_InfoHasBit(Ivy_ObjSim(pObj)->pData, BestPat);
//        printf( "%d", pModel[i] );
    }
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}